

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O2

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetDstMemoryBarriers
          (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
           *__return_storage_ptr__,ImageBase *this,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  VkImage pVVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  allocator_type local_49;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *local_48;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *local_40;
  ImageBase *local_38;
  
  local_48 = __return_storage_ptr__;
  local_40 = regions;
  local_38 = this;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(regions->
                   super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x38,&local_49);
  pVVar1 = (local_40->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (local_40->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = (local_48->
           super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = local_38->m_image;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)(((long)pVVar2 - (long)pVVar1) / 0x38);
      uVar6 = uVar6 + 1) {
    pVVar3[uVar7].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    pVVar3[uVar7].image = pVVar4;
    pVVar3[uVar7].oldLayout = old_layout;
    pVVar3[uVar7].newLayout = new_layout;
    pVVar3[uVar7].srcAccessMask = src_access_mask;
    pVVar3[uVar7].dstAccessMask = dst_access_mask;
    pVVar3[uVar7].srcQueueFamilyIndex = src_queue_family;
    pVVar3[uVar7].dstQueueFamilyIndex = dst_queue_family;
    uVar5 = pVVar1[uVar7].imageSubresource.mipLevel;
    pVVar3[uVar7].subresourceRange.aspectMask = pVVar1[uVar7].imageSubresource.aspectMask;
    pVVar3[uVar7].subresourceRange.baseMipLevel = uVar5;
    pVVar3[uVar7].subresourceRange.levelCount = 1;
    uVar5 = pVVar1[uVar7].imageSubresource.layerCount;
    pVVar3[uVar7].subresourceRange.baseArrayLayer = pVVar1[uVar7].imageSubresource.baseArrayLayer;
    pVVar3[uVar7].subresourceRange.layerCount = uVar5;
  }
  return local_48;
}

Assistant:

std::vector<VkImageMemoryBarrier>
ImageBase::GetDstMemoryBarriers(const std::vector<VkBufferImageCopy> &regions, VkAccessFlags src_access_mask,
                                VkAccessFlags dst_access_mask, VkImageLayout old_layout, VkImageLayout new_layout,
                                uint32_t src_queue_family, uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());

	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		VkImageSubresourceRange &range = cur.subresourceRange;
		range.aspectMask = regions[i].imageSubresource.aspectMask;
		range.baseMipLevel = regions[i].imageSubresource.mipLevel;
		range.levelCount = 1;
		range.baseArrayLayer = regions[i].imageSubresource.baseArrayLayer;
		range.layerCount = regions[i].imageSubresource.layerCount;
	}
	return barriers;
}